

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall QMap<int,_QString>::insert(QMap<int,_QString> *this,int *key,QString *value)

{
  long lVar1;
  bool bVar2;
  QMap<int,_QString> *in_RDI;
  long in_FS_OFFSET;
  QMap<int,_QString> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_> *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_> *)
            &DAT_aaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<int,_QString> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<int,_QString> *)0x7c0f32);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
                *)0x7c0f46);
  std::map<int,QString,std::less<int>,std::allocator<std::pair<int_const,QString>>>::
  insert_or_assign<QString_const&>
            (this_00,in_stack_ffffffffffffffd0,
             (QString *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x7c0f90,in_stack_ffffffffffffff98);
  ~QMap((QMap<int,_QString> *)0x7c0f9a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }